

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplydataimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyDataImpl::QNetworkReplyDataImpl
          (QNetworkReplyDataImpl *this,QObject *parent,QNetworkRequest *req,Operation op)

{
  long lVar1;
  QAnyStringView newValue;
  char cVar2;
  QNetworkReplyPrivate *this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView newValue_00;
  QHttpHeaders h;
  qint64 size;
  QUrl url;
  QNetworkReply local_100;
  QChar local_f0;
  QString local_e8;
  QByteArray local_c8;
  QArrayData *local_a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_a0;
  long local_98;
  QNetworkRequest local_90;
  QNetworkRequest local_88;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_80;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_78;
  char *pcStack_70;
  QMetaTypeInterface *local_68;
  InterfaceType *pIStack_60;
  QMetaTypeInterface *local_58;
  undefined8 *puStack_50;
  undefined8 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkReplyPrivate *)operator_new(0x240);
  QNetworkReplyPrivate::QNetworkReplyPrivate(this_00);
  *(undefined ***)this_00 = &PTR__QNetworkReplyDataImplPrivate_002d0668;
  QBuffer::QBuffer((QBuffer *)(this_00 + 1),(QObject *)0x0);
  QNetworkReply::QNetworkReply((QNetworkReply *)this,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002d06b0;
  lVar1 = *(long *)(this + 8);
  QNetworkReply::setRequest((QNetworkReply *)this,req);
  QNetworkRequest::url(&local_88);
  QNetworkReply::setUrl((QNetworkReply *)this,(QUrl *)&local_88);
  QUrl::~QUrl((QUrl *)&local_88);
  QNetworkReply::setOperation((QNetworkReply *)this,op);
  QNetworkReply::setFinished((QNetworkReply *)this,true);
  QIODevice::open(this,1);
  local_90.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::url(&local_90);
  local_a8 = (QArrayData *)0x0;
  aStack_a0.m_data = (void *)0x0;
  local_98 = 0;
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char *)0x0;
  local_c8.d.size = 0;
  cVar2 = qDecodeDataUrl((QUrl *)&local_90,(QString *)&local_a8,&local_c8);
  if (cVar2 == '\0') {
    local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QCoreApplication::translate((char *)&local_88,"QNetworkAccessDataBackend","Invalid URI: %1",0);
    QUrl::toString(&local_100,&local_90,0);
    QVar3.m_size = (size_t)&local_88;
    QVar3.field_0.m_data = &local_e8;
    QString::arg_impl(QVar3,local_100._8_4_,local_f0);
    if ((QArrayData *)local_100._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_100._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_100._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_100._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_100._0_8_,2,0x10);
      }
    }
    if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0) {
      LOCK();
      *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + -1;
      UNLOCK();
      if (*(int *)local_88.d.d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_88.d.d.ptr,2,0x10);
      }
    }
    QNetworkReply::setError((QNetworkReply *)this,ProtocolFailure,&local_e8);
    local_100._0_4_ = 399;
    local_88.d.d.ptr =
         (QSharedDataPointer<QNetworkRequestPrivate>)
         (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
    local_78.m_data = (void *)0x0;
    pcStack_70 = "QNetworkReply::NetworkError";
    local_68 = (QMetaTypeInterface *)0x0;
    pIStack_60 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
    aStack_80.m_data = &local_100;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"errorOccurred",QueuedConnection,2,(void **)&local_88,
               &local_78.m_data_utf8,&local_68);
    local_88.d.d.ptr =
         (QSharedDataPointer<QNetworkRequestPrivate>)
         (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
    aStack_80.m_data = (void *)0x0;
    local_78.m_data = (void *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"finished",QueuedConnection,1,(void **)&local_88,
               &aStack_80.m_data_utf8,(QMetaTypeInterface **)&local_78.m_data);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_e8.d.d = (Data *)local_c8.d.size;
    local_100._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QNetworkReply::headers(&local_100);
    newValue_00.m_size = local_98 + 0x8000000000000000;
    newValue_00.field_0.m_data = aStack_a0.m_data;
    QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_100,ContentType,newValue_00);
    QByteArray::number((longlong)&local_88,(int)local_e8.d.d);
    newValue.m_size = (size_t)local_78.m_data;
    newValue.field_0.m_data = aStack_80.m_data;
    QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_100,ContentLength,newValue);
    if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0) {
      LOCK();
      *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + -1;
      UNLOCK();
      if (*(int *)local_88.d.d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_88.d.d.ptr,1,0x10);
      }
    }
    QNetworkReply::setHeaders((QNetworkReply *)this,(QHttpHeaders *)&local_100);
    local_88.d.d.ptr =
         (QSharedDataPointer<QNetworkRequestPrivate>)
         (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
    aStack_80.m_data = (void *)0x0;
    local_78.m_data = (void *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"metaDataChanged",QueuedConnection,1,(void **)&local_88,
               &aStack_80.m_data_utf8,(QMetaTypeInterface **)&local_78.m_data);
    QBuffer::setData((QByteArray *)(lVar1 + 0x230));
    QBuffer::open((QByteArray *)(lVar1 + 0x230),1);
    local_88.d.d.ptr =
         (QSharedDataPointer<QNetworkRequestPrivate>)
         (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
    aStack_80.m_data = &local_e8;
    pcStack_70 = (char *)0x0;
    local_68 = (QMetaTypeInterface *)0x261413;
    pIStack_60 = (InterfaceType *)0x261413;
    local_58 = (QMetaTypeInterface *)0x0;
    puStack_50 = &QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
    local_48 = &QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
    local_78.m_data = aStack_80.m_data;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"downloadProgress",QueuedConnection,3,(void **)&local_88,&pcStack_70,
               &local_58);
    local_88.d.d.ptr =
         (QSharedDataPointer<QNetworkRequestPrivate>)
         (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
    aStack_80.m_data = (void *)0x0;
    local_78.m_data = (void *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"readyRead",QueuedConnection,1,(void **)&local_88,
               &aStack_80.m_data_utf8,(QMetaTypeInterface **)&local_78.m_data);
    local_88.d.d.ptr =
         (QSharedDataPointer<QNetworkRequestPrivate>)
         (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
    aStack_80.m_data = (void *)0x0;
    local_78.m_data = (void *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"finished",QueuedConnection,1,(void **)&local_88,
               &aStack_80.m_data_utf8,(QMetaTypeInterface **)&local_78.m_data);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_100);
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyDataImpl::QNetworkReplyDataImpl(QObject *parent, const QNetworkRequest &req, const QNetworkAccessManager::Operation op)
    : QNetworkReply(*new QNetworkReplyDataImplPrivate(), parent)
{
    Q_D(QNetworkReplyDataImpl);
    setRequest(req);
    setUrl(req.url());
    setOperation(op);
    setFinished(true);
    QNetworkReply::open(QIODevice::ReadOnly);

    QUrl url = req.url();
    QString mimeType;
    QByteArray payload;
    if (qDecodeDataUrl(url, mimeType, payload)) {
        qint64 size = payload.size();
        auto h = headers();
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentType, mimeType);
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentLength, QByteArray::number(size));
        setHeaders(std::move(h));

        QMetaObject::invokeMethod(this, "metaDataChanged", Qt::QueuedConnection);

        d->decodedData.setData(payload);
        d->decodedData.open(QIODevice::ReadOnly);

        QMetaObject::invokeMethod(this, "downloadProgress", Qt::QueuedConnection,
                                  Q_ARG(qint64,size), Q_ARG(qint64, size));
        QMetaObject::invokeMethod(this, "readyRead", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    } else {
        // something wrong with this URI
        const QString msg = QCoreApplication::translate("QNetworkAccessDataBackend",
                                                        "Invalid URI: %1").arg(url.toString());
        setError(QNetworkReply::ProtocolFailure, msg);
        QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                                  Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ProtocolFailure));
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    }
}